

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O0

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)

{
  int local_14;
  int k;
  PreFiltBankstr *prefiltdata_local;
  
  for (local_14 = 0; local_14 < 0x18; local_14 = local_14 + 1) {
    prefiltdata->INLABUF1[local_14] = 0.0;
    prefiltdata->INLABUF2[local_14] = 0.0;
    prefiltdata->INLABUF1_float[local_14] = 0.0;
    prefiltdata->INLABUF2_float[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    prefiltdata->INSTAT1[local_14] = 0.0;
    prefiltdata->INSTAT2[local_14] = 0.0;
    prefiltdata->INSTATLA1[local_14] = 0.0;
    prefiltdata->INSTATLA2[local_14] = 0.0;
    prefiltdata->INSTAT1_float[local_14] = 0.0;
    prefiltdata->INSTAT2_float[local_14] = 0.0;
    prefiltdata->INSTATLA1_float[local_14] = 0.0;
    prefiltdata->INSTATLA2_float[local_14] = 0.0;
  }
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;
  prefiltdata->HPstates_float[0] = 0.0;
  prefiltdata->HPstates_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)
{
  int k;

  for (k = 0; k < QLOOKAHEAD; k++) {
    prefiltdata->INLABUF1[k] = 0;
    prefiltdata->INLABUF2[k] = 0;

    prefiltdata->INLABUF1_float[k] = 0;
    prefiltdata->INLABUF2_float[k] = 0;
  }
  for (k = 0; k < 2*(QORDER-1); k++) {
    prefiltdata->INSTAT1[k] = 0;
    prefiltdata->INSTAT2[k] = 0;
    prefiltdata->INSTATLA1[k] = 0;
    prefiltdata->INSTATLA2[k] = 0;

    prefiltdata->INSTAT1_float[k] = 0;
    prefiltdata->INSTAT2_float[k] = 0;
    prefiltdata->INSTATLA1_float[k] = 0;
    prefiltdata->INSTATLA2_float[k] = 0;
  }

  /* High pass filter states */
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;

  prefiltdata->HPstates_float[0] = 0.0f;
  prefiltdata->HPstates_float[1] = 0.0f;

  return;
}